

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

bool __thiscall
QVLABase<QRhiRenderTargetAttachmentTracker::ResId>::equal<QRhiRenderTargetAttachmentTracker::ResId>
          (QVLABase<QRhiRenderTargetAttachmentTracker::ResId> *this,
          QVLABase<QRhiRenderTargetAttachmentTracker::ResId> *other)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  lVar1 = (this->super_QVLABaseBase).s;
  if (lVar1 != (other->super_QVLABaseBase).s) {
    return false;
  }
  bVar7 = lVar1 == 0;
  if (!bVar7) {
    plVar2 = (long *)(this->super_QVLABaseBase).ptr;
    plVar3 = (long *)(other->super_QVLABaseBase).ptr;
    bVar7 = false;
    if ((*plVar2 == *plVar3) && ((int)plVar2[1] == (int)plVar3[1])) {
      lVar6 = 0;
      while (bVar7 = lVar1 * 0x10 + -0x10 == lVar6, !bVar7) {
        if (*(long *)((long)plVar2 + lVar6 + 0x10) != *(long *)((long)plVar3 + lVar6 + 0x10)) {
          return false;
        }
        lVar4 = lVar6 + 0x18;
        lVar5 = lVar6 + 0x18;
        lVar6 = lVar6 + 0x10;
        if (*(int *)((long)plVar2 + lVar5) != *(int *)((long)plVar3 + lVar4)) {
          return false;
        }
      }
    }
  }
  return bVar7;
}

Assistant:

constexpr size_type size() const noexcept { return s; }